

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsItem::mouseMoveEvent(QGraphicsItem *this,QGraphicsSceneMouseEvent *event)

{
  uchar *puVar1;
  QGraphicsScene *this_00;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  MouseButtons MVar6;
  QWidget *pQVar7;
  Node<QGraphicsItem_*,_QPointF> *pNVar8;
  QGraphicsItemPrivate *pQVar9;
  QPoint QVar10;
  bool bVar11;
  long lVar12;
  TryEmplaceResult *pTVar13;
  undefined8 *puVar14;
  qreal *pqVar15;
  QTransform *pQVar16;
  QGraphicsItem *pQVar17;
  QTransform *pQVar18;
  ulong uVar19;
  double dVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  byte bVar22;
  double dVar23;
  double in_XMM1_Qa;
  qreal qVar24;
  qreal qVar25;
  QPointF QVar26;
  QGraphicsItem *item;
  QTransform itemTransform;
  QWidget *local_2a0;
  Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *local_280;
  qreal local_278;
  qreal local_268;
  QGraphicsItem *local_228;
  QHash<QGraphicsItem_*,_QPointF> local_220;
  QTransform local_218;
  QTransform local_1c8;
  QTransform local_178;
  QTransform local_128;
  QTransform local_d8;
  TryEmplaceResult local_88 [3];
  undefined2 local_40;
  long local_38;
  
  bVar22 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MVar6 = QGraphicsSceneMouseEvent::buttons(event);
  if ((((uint)MVar6.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
              super_QFlagsStorage<Qt::MouseButton>.i & 1) == 0) ||
     (pQVar9 = (this->d_ptr).d, (pQVar9->field_0x164 & 1) == 0)) {
    (event->super_QGraphicsSceneEvent).field_0xc = 0;
  }
  else {
    local_220.d = (Data *)0x0;
    this_00 = (QGraphicsScene *)pQVar9->scene;
    if (this_00 == (QGraphicsScene *)0x0) {
      uVar21 = 0;
      dVar20 = 0.0;
      local_280 = (Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)0x0;
    }
    else {
      QGraphicsScene::selectedItems((QList<QGraphicsItem_*> *)local_88,this_00);
      dVar20 = (double)local_88[0].iterator.i.bucket;
      local_280 = local_88[0].iterator.i.d;
      QHash<QGraphicsItem_*,_QPointF>::operator=
                (&local_220,
                 (QHash<QGraphicsItem_*,_QPointF> *)
                 (*(long *)&((this->d_ptr).d)->scene->field_0x8 + 0x160));
      if ((local_220.d == (Data *)0x0) || ((local_220.d)->size == 0)) {
        if (local_88[0]._16_8_ != 0) {
          lVar12 = 0;
          do {
            local_d8.m_matrix[0][0] = *(qreal *)((long)dVar20 + lVar12);
            uVar3 = *(undefined8 *)
                     (((Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)
                      local_d8.m_matrix[0][0])->size + 0x68);
            uVar4 = *(undefined8 *)
                     (((Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)
                      local_d8.m_matrix[0][0])->size + 0x70);
            QHash<QGraphicsItem*,QPointF>::tryEmplace_impl<QGraphicsItem*const&>
                      (local_88,&local_220,(QGraphicsItem **)&local_d8);
            puVar1 = (local_88[0].iterator.i.d)->spans[local_88[0].iterator.i.bucket >> 7].entries
                     [(local_88[0].iterator.i.d)->spans[local_88[0].iterator.i.bucket >> 7].offsets
                      [(uint)local_88[0].iterator.i.bucket & 0x7f]].storage.data + 8;
            *(undefined8 *)puVar1 = uVar3;
            *(undefined8 *)(puVar1 + 8) = uVar4;
            lVar12 = lVar12 + 8;
          } while (local_88[0]._16_8_ * 8 - lVar12 != 0);
        }
        pQVar9 = (this->d_ptr).d;
        qVar24 = (pQVar9->pos).xp;
        qVar25 = (pQVar9->pos).yp;
        local_d8.m_matrix[0][0] = (qreal)this;
        QHash<QGraphicsItem*,QPointF>::tryEmplace_impl<QGraphicsItem*const&>
                  (local_88,&local_220,(QGraphicsItem **)&local_d8);
        puVar1 = (local_88[0].iterator.i.d)->spans[local_88[0].iterator.i.bucket >> 7].entries
                 [(local_88[0].iterator.i.d)->spans[local_88[0].iterator.i.bucket >> 7].offsets
                  [(uint)local_88[0].iterator.i.bucket & 0x7f]].storage.data + 8;
        *(qreal *)puVar1 = qVar24;
        *(qreal *)(puVar1 + 8) = qVar25;
      }
      QHash<QGraphicsItem_*,_QPointF>::operator=
                ((QHash<QGraphicsItem_*,_QPointF> *)
                 (*(long *)&((this->d_ptr).d)->scene->field_0x8 + 0x160),&local_220);
      uVar21 = local_88[0]._16_8_;
    }
    pQVar7 = QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
    if (pQVar7 == (QWidget *)0x0) {
      local_2a0 = (QWidget *)0x0;
    }
    else {
      QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
      local_2a0 = (QWidget *)QMetaObject::cast((QObject *)&QGraphicsView::staticMetaObject);
    }
    uVar19 = 0;
    bVar11 = false;
    do {
      local_228 = this;
      if (((uVar21 <= uVar19) ||
          (local_228 = *(QGraphicsItem **)((long)dVar20 + uVar19 * 8), bVar5 = bVar11,
          local_228 == this)) && (bVar5 = true, bVar11)) break;
      bVar11 = bVar5;
      if (((*(ulong *)&((local_228->d_ptr).d)->field_0x160 & 0x100000000) != 0) &&
         (bVar5 = QGraphicsItemPrivate::movableAncestorIsSelected(local_228), pQVar17 = local_228,
         !bVar5)) {
        if (local_2a0 == (QWidget *)0x0) {
LAB_005e269d:
          QVar26 = QGraphicsSceneMouseEvent::scenePos(event);
          local_d8.m_matrix[0][1] = QVar26.yp;
          local_d8.m_matrix[0][0] = QVar26.xp;
          QVar26 = mapFromScene(pQVar17,(QPointF *)&local_d8);
          local_88[0].iterator.i.bucket = (size_t)QVar26.yp;
          local_88[0].iterator.i.d =
               (Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)QVar26.xp;
          QVar26 = mapToParent(pQVar17,(QPointF *)local_88);
          pQVar17 = local_228;
          local_278 = QVar26.yp;
          local_268 = QVar26.xp;
          pTVar13 = local_88;
          QVar26 = QGraphicsSceneMouseEvent::buttonDownScenePos(event,LeftButton);
          local_d8.m_matrix[0][1] = QVar26.yp;
          local_d8.m_matrix[0][0] = QVar26.xp;
          QVar26 = mapFromScene(pQVar17,(QPointF *)&local_d8);
          local_88[0].iterator.i.bucket = (size_t)QVar26.yp;
          local_88[0].iterator.i.d =
               (Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)QVar26.xp;
LAB_005e28a7:
          QVar26 = mapToParent(pQVar17,(QPointF *)pTVar13);
          in_XMM1_Qa = QVar26.yp;
          dVar23 = QVar26.xp;
        }
        else {
          uVar2 = *(ulong *)&((local_228->d_ptr).d)->field_0x160;
          if (((uint)uVar2 >> 0x12 & 1) != 0) {
            puVar14 = &DAT_006f1ed0;
            pTVar13 = local_88;
            for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pTVar13->iterator).i.d =
                   (Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)*puVar14;
              puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
              pTVar13 = (TryEmplaceResult *)((long)pTVar13 + ((ulong)bVar22 * -2 + 1) * 8);
            }
            QGraphicsView::viewportTransform(&local_128,(QGraphicsView *)local_2a0);
            deviceTransform(&local_d8,pQVar17,&local_128);
            QTransform::inverted((bool *)local_88);
            local_178.m_matrix[0][0] = (qreal)QGraphicsSceneMouseEvent::screenPos(event);
            QVar10 = QWidget::mapFromGlobal(local_2a0,(QPoint *)&local_178);
            local_128.m_matrix[0][0] = (qreal)QVar10.xp.m_i.m_i;
            local_128.m_matrix[0][1] = (qreal)QVar10.yp.m_i.m_i;
            local_d8.m_matrix[0][0] = (qreal)QTransform::map((QPointF *)local_88);
            local_d8.m_matrix[0][1] = in_XMM1_Qa;
            QVar26 = mapToParent(this,(QPointF *)&local_d8);
            local_278 = QVar26.yp;
            local_268 = QVar26.xp;
            qVar24 = local_278;
            local_178.m_matrix[0][0] =
                 (qreal)QGraphicsSceneMouseEvent::buttonDownScreenPos(event,LeftButton);
            QVar10 = QWidget::mapFromGlobal(local_2a0,(QPoint *)&local_178);
            local_128.m_matrix[0][0] = (qreal)QVar10.xp.m_i.m_i;
            local_128.m_matrix[0][1] = (qreal)QVar10.yp.m_i.m_i;
            local_d8.m_matrix[0][0] = (qreal)QTransform::map((QPointF *)local_88);
            pTVar13 = (TryEmplaceResult *)&local_d8;
            pQVar17 = this;
            local_d8.m_matrix[0][1] = qVar24;
            goto LAB_005e28a7;
          }
          if ((uVar2 >> 0x25 & 1) == 0) goto LAB_005e269d;
          puVar14 = &DAT_006f1ed0;
          pTVar13 = local_88;
          for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pTVar13->iterator).i.d =
                 (Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)*puVar14;
            puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
            pTVar13 = (TryEmplaceResult *)((long)pTVar13 + ((ulong)bVar22 * -2 + 1) * 8);
          }
          puVar14 = &DAT_006f1e88;
          pTVar13 = local_88;
          for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pTVar13->iterator).i.d =
                 (Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)*puVar14;
            puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
            pTVar13 = (TryEmplaceResult *)((long)pTVar13 + ((ulong)bVar22 * -2 + 1) * 8);
          }
          local_40 = 0xa800;
          pQVar9 = (local_228->d_ptr).d;
          if (pQVar9->transformData != (TransformData *)0x0) {
            QGraphicsItemPrivate::TransformData::computedFullTransform
                      (&local_d8,pQVar9->transformData,(QTransform *)0x0);
            pQVar16 = &local_d8;
            pTVar13 = local_88;
            for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pTVar13->iterator).i.d =
                   (Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)pQVar16->m_matrix[0][0];
              pQVar16 = (QTransform *)((long)pQVar16 + ((ulong)bVar22 * -2 + 1) * 8);
              pTVar13 = (TryEmplaceResult *)((long)pTVar13 + ((ulong)bVar22 * -2 + 1) * 8);
            }
            local_40 = local_d8._72_2_;
            pQVar9 = (local_228->d_ptr).d;
          }
          local_278 = (pQVar9->pos).yp;
          QTransform::translate((pQVar9->pos).xp,local_278);
          pQVar17 = local_228;
          pqVar15 = (qreal *)&DAT_006f1ed0;
          pQVar16 = &local_d8;
          for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
            pQVar16->m_matrix[0][0] = *pqVar15;
            pqVar15 = pqVar15 + (ulong)bVar22 * -2 + 1;
            pQVar16 = (QTransform *)((long)pQVar16 + ((ulong)bVar22 * -2 + 1) * 8);
          }
          pQVar9 = (local_228->d_ptr).d;
          local_128.m_matrix[0][0] = (qreal)pQVar9->q_ptr;
          QGraphicsItemPrivate::ensureSceneTransformRecursive(pQVar9,(QGraphicsItem **)&local_128);
          pQVar16 = &((pQVar17->d_ptr).d)->sceneTransform;
          pQVar18 = &local_1c8;
          for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
            pQVar18->m_matrix[0][0] = pQVar16->m_matrix[0][0];
            pQVar16 = (QTransform *)((long)pQVar16 + (ulong)bVar22 * -0x10 + 8);
            pQVar18 = (QTransform *)((long)pQVar18 + ((ulong)bVar22 * -2 + 1) * 8);
          }
          QGraphicsView::viewportTransform(&local_218,(QGraphicsView *)local_2a0);
          QTransform::operator*(&local_178,&local_1c8);
          QTransform::inverted((bool *)&local_128);
          QTransform::operator*(&local_d8,(QTransform *)local_88);
          local_178.m_matrix[0][0] = (qreal)QGraphicsSceneMouseEvent::screenPos(event);
          QVar10 = QWidget::mapFromGlobal(local_2a0,(QPoint *)&local_178);
          local_128.m_matrix[0][0] = (qreal)QVar10.xp.m_i.m_i;
          local_128.m_matrix[0][1] = (qreal)QVar10.yp.m_i.m_i;
          local_268 = (qreal)QTransform::map((QPointF *)&local_d8);
          in_XMM1_Qa = local_278;
          local_178.m_matrix[0][0] =
               (qreal)QGraphicsSceneMouseEvent::buttonDownScreenPos(event,LeftButton);
          QVar10 = QWidget::mapFromGlobal(local_2a0,(QPoint *)&local_178);
          local_128.m_matrix[0][0] = (qreal)QVar10.xp.m_i.m_i;
          local_128.m_matrix[0][1] = (qreal)QVar10.yp.m_i.m_i;
          dVar23 = (double)QTransform::map((QPointF *)&local_d8);
        }
        pQVar17 = local_228;
        qVar24 = 0.0;
        qVar25 = 0.0;
        if (local_220.d != (Data *)0x0) {
          pNVar8 = QHashPrivate::Data<QHashPrivate::Node<QGraphicsItem*,QPointF>>::
                   findNode<QGraphicsItem*>
                             ((Data<QHashPrivate::Node<QGraphicsItem*,QPointF>> *)local_220.d,
                              &local_228);
          qVar24 = 0.0;
          qVar25 = 0.0;
          if (pNVar8 != (Node<QGraphicsItem_*,_QPointF> *)0x0) {
            qVar24 = (pNVar8->value).xp;
            qVar25 = (pNVar8->value).yp;
          }
        }
        local_88[0].iterator.i.d =
             (Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)((local_268 + qVar24) - dVar23);
        local_88[0].iterator.i.bucket = (size_t)((local_278 + qVar25) - in_XMM1_Qa);
        setPos(pQVar17,(QPointF *)local_88);
        if ((((local_228->d_ptr).d)->field_0x164 & 2) != 0) {
          setSelected(local_228,true);
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar21 + 1 != uVar19);
    QHash<QGraphicsItem_*,_QPointF>::~QHash(&local_220);
    if (local_280 != (Data<QHashPrivate::Node<QGraphicsItem_*,_QPointF>_> *)0x0) {
      LOCK();
      (local_280->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (local_280->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_280->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_280,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::mouseMoveEvent(QGraphicsSceneMouseEvent *event)
{
    if ((event->buttons() & Qt::LeftButton) && (flags() & ItemIsMovable)) {
        // Determine the list of items that need to be moved.
        QList<QGraphicsItem *> selectedItems;
        QHash<QGraphicsItem *, QPointF> initialPositions;
        if (d_ptr->scene) {
            selectedItems = d_ptr->scene->selectedItems();
            initialPositions = d_ptr->scene->d_func()->movingItemsInitialPositions;
            if (initialPositions.isEmpty()) {
                for (QGraphicsItem *item : std::as_const(selectedItems))
                    initialPositions[item] = item->pos();
                initialPositions[this] = pos();
            }
            d_ptr->scene->d_func()->movingItemsInitialPositions = initialPositions;
        }

        // Find the active view.
        QGraphicsView *view = nullptr;
        if (event->widget())
            view = qobject_cast<QGraphicsView *>(event->widget()->parentWidget());

        // Move all selected items
        int i = 0;
        bool movedMe = false;
        while (i <= selectedItems.size()) {
            QGraphicsItem *item = nullptr;
            if (i < selectedItems.size())
                item = selectedItems.at(i);
            else
                item = this;
            if (item == this) {
                // Slightly clumsy-looking way to ensure that "this" is part
                // of the list of items to move, this is to avoid allocations
                // (appending this item to the list of selected items causes a
                // detach).
                if (movedMe)
                    break;
                movedMe = true;
            }

            if ((item->flags() & ItemIsMovable) && !QGraphicsItemPrivate::movableAncestorIsSelected(item)) {
                QPointF currentParentPos;
                QPointF buttonDownParentPos;
                if (view && (item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorIgnoresTransformations)) {
                    // Items whose ancestors ignore transformations need to
                    // map screen coordinates to local coordinates, then map
                    // those to the parent.
                    QTransform viewToItemTransform = (item->deviceTransform(view->viewportTransform())).inverted();
                    currentParentPos = mapToParent(viewToItemTransform.map(QPointF(view->mapFromGlobal(event->screenPos()))));
                    buttonDownParentPos = mapToParent(viewToItemTransform.map(QPointF(view->mapFromGlobal(event->buttonDownScreenPos(Qt::LeftButton)))));
                } else if (view && (item->flags() & ItemIgnoresTransformations)) {
                    // Root items that ignore transformations need to
                    // calculate their diff by mapping viewport coordinates
                    // directly to parent coordinates.
                    // COMBINE
                    QTransform itemTransform;
                    if (item->d_ptr->transformData)
                        itemTransform = item->d_ptr->transformData->computedFullTransform();
                    itemTransform.translate(item->d_ptr->pos.x(), item->d_ptr->pos.y());
                    QTransform viewToParentTransform = itemTransform
                                                       * (item->sceneTransform() * view->viewportTransform()).inverted();
                    currentParentPos = viewToParentTransform.map(QPointF(view->mapFromGlobal(event->screenPos())));
                    buttonDownParentPos = viewToParentTransform.map(QPointF(view->mapFromGlobal(event->buttonDownScreenPos(Qt::LeftButton))));
                } else {
                    // All other items simply map from the scene.
                    currentParentPos = item->mapToParent(item->mapFromScene(event->scenePos()));
                    buttonDownParentPos = item->mapToParent(item->mapFromScene(event->buttonDownScenePos(Qt::LeftButton)));
                }

                item->setPos(initialPositions.value(item) + currentParentPos - buttonDownParentPos);

                if (item->flags() & ItemIsSelectable)
                    item->setSelected(true);
            }
            ++i;
        }

    } else {
        event->ignore();
    }
}